

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)10,(moira::Mode)7,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 v;
  StrWriter *pSVar1;
  StrWriter *in_RSI;
  long in_RDI;
  Ea<(moira::Mode)7,_(moira::Size)4> dst;
  Imu src;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined6 in_stack_ffffffffffffffc8;
  u16 in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  Imu in_stack_ffffffffffffffd4;
  Imu local_20 [4];
  StrWriter *local_10;
  
  local_10 = in_RSI;
  v = dasmRead<(moira::Size)4>
                ((Moira *)CONCAT44(in_stack_ffffffffffffffd4.raw,in_stack_ffffffffffffffd0),
                 (u32 *)CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8));
  Imu::Imu(local_20,v);
  Op<(moira::Mode)7,(moira::Size)4>
            ((Moira *)CONCAT44(in_stack_ffffffffffffffd4.raw,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffce,
             (u32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pSVar1 = StrWriter::operator<<(local_10);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)*(int *)(in_RDI + 0x14));
  pSVar1 = StrWriter::operator<<
                     ((StrWriter *)CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffd4);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<
            ((StrWriter *)CONCAT44(in_stack_ffffffffffffffd4.raw,in_stack_ffffffffffffffd0),
             (Ea<(moira::Mode)7,_(moira::Size)4> *)
             CONCAT26(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu      ( dasmRead<S>(addr)          );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}